

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O1

void __thiscall TPZCheckMesh::DependencyReport(TPZCheckMesh *this,int connect)

{
  ostream *this_00;
  long *plVar1;
  TPZCompElSide large;
  TPZCompElSide TStack_28;
  
  this_00 = this->fOut;
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"DependencyReport for connect ",0x1d);
  plVar1 = (long *)std::ostream::operator<<(this_00,connect);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  FindElement((TPZCheckMesh *)&TStack_28,(int)this);
  DependencyReport(this,connect,&TStack_28);
  return;
}

Assistant:

void TPZCheckMesh::DependencyReport(int connect) {
	
	(*fOut) << "DependencyReport for connect " << connect << endl;
	TPZCompElSide large = FindElement(connect);
	DependencyReport(connect, large);
}